

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O0

void haarXY(integral_image *iimage,int row,int col,int scale,float *haarX,float *haarY)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  float *in_R8;
  float *in_R9;
  int _b_2;
  int _a_2;
  int r1;
  int _b_1;
  int _a_1;
  int c0;
  int _b;
  int _a;
  int r0;
  int height;
  int width;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float r2c0_sub_r0c2;
  float r2c2_sub_r0c0;
  int data_width;
  float *data;
  float r2c2;
  float r2c1;
  float r2c0;
  float r1c2;
  float r1c0;
  float r0c2;
  float r0c1;
  float r0c0;
  int _b_5;
  int _a_5;
  int c2;
  int _b_4;
  int _a_4;
  int r2;
  int _b_3;
  int _a_3;
  int c1;
  
  local_dc = *in_RDI;
  local_d8 = in_RDI[1];
  local_c8 = local_d8;
  if (in_ESI < local_d8) {
    local_c8 = in_ESI;
  }
  local_c8 = local_c8 + -1;
  local_cc = local_dc;
  if (in_EDX < local_dc) {
    local_cc = in_EDX;
  }
  local_cc = local_cc + -1;
  local_d0 = local_d8;
  if (in_ESI + in_ECX < local_d8) {
    local_d0 = in_ESI + in_ECX;
  }
  local_d0 = local_d0 + -1;
  local_d4 = local_dc;
  if (in_EDX + in_ECX < local_dc) {
    local_d4 = in_EDX + in_ECX;
  }
  local_d4 = local_d4 + -1;
  iVar3 = in_ESI + in_ECX * 2;
  if (iVar3 < local_d8) {
    local_d8 = iVar3;
  }
  local_d8 = local_d8 + -1;
  iVar3 = in_EDX + in_ECX * 2;
  if (iVar3 < local_dc) {
    local_dc = iVar3;
  }
  local_dc = local_dc + -1;
  local_94 = 0.0;
  local_98 = 0.0;
  local_9c = 0.0;
  local_a0 = 0.0;
  local_a4 = 0.0;
  local_a8 = 0.0;
  local_ac = 0.0;
  local_b0 = 0.0;
  lVar1 = *(long *)(in_RDI + 2);
  iVar3 = in_RDI[4];
  if ((-1 < local_c8) && (-1 < local_cc)) {
    local_94 = *(float *)(lVar1 + (long)(local_c8 * iVar3 + local_cc) * 4);
  }
  if ((-1 < local_c8) && (-1 < local_d4)) {
    local_98 = *(float *)(lVar1 + (long)(local_c8 * iVar3 + local_d4) * 4);
  }
  if ((-1 < local_c8) && (-1 < local_dc)) {
    local_9c = *(float *)(lVar1 + (long)(local_c8 * iVar3 + local_dc) * 4);
  }
  if ((-1 < local_d0) && (-1 < local_cc)) {
    local_a0 = *(float *)(lVar1 + (long)(local_d0 * iVar3 + local_cc) * 4);
  }
  if ((-1 < local_d0) && (-1 < local_dc)) {
    local_a4 = *(float *)(lVar1 + (long)(local_d0 * iVar3 + local_dc) * 4);
  }
  if ((-1 < local_d8) && (-1 < local_cc)) {
    local_a8 = *(float *)(lVar1 + (long)(local_d8 * iVar3 + local_cc) * 4);
  }
  if ((-1 < local_d8) && (-1 < local_d4)) {
    local_ac = *(float *)(lVar1 + (long)(local_d8 * iVar3 + local_d4) * 4);
  }
  if ((-1 < local_d8) && (-1 < local_dc)) {
    local_b0 = *(float *)(lVar1 + (long)(local_d8 * iVar3 + local_dc) * 4);
  }
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(local_98 - local_ac)),
                           ZEXT416((uint)(local_b0 - local_94)));
  *in_R8 = auVar2._0_4_ + (local_a8 - local_9c);
  auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(local_a0 - local_a4)),
                           ZEXT416((uint)(local_b0 - local_94)));
  *in_R9 = auVar2._0_4_ - (local_a8 - local_9c);
  return;
}

Assistant:

inline void haarXY(struct integral_image *iimage, int row, int col, int scale, float* haarX, float* haarY) {
    
    // TODO: (Sebastian) fix for iimage with padding
    int width = iimage->width;
    int height = iimage->height;

    // subtracting by one for row/col because row/col is inclusive.
    int r0 = MIN(row, height) - 1;         
    int c0 = MIN(col, width) - 1;         
    int r1 = MIN(row + scale, height) - 1;  
    int c1 = MIN(col + scale, width) - 1;   
    int r2 = MIN(row + 2*scale, height) - 1;
    int c2 = MIN(col + 2*scale, width) - 1;

    float r0c0 = 0.0f; // A
    float r0c1 = 0.0f; // B
    float r0c2 = 0.0f; // C
    float r1c0 = 0.0f; // D
    float r1c2 = 0.0f; // E
    float r2c0 = 0.0f; // F
    float r2c1 = 0.0f; // G
    float r2c2 = 0.0f; // H

    float *data = iimage->data;
    int data_width = iimage->data_width;

    if (r0 >= 0 && c0 >= 0)  {
        r0c0 = data[r0 * data_width + c0];
    }
    if (r0 >= 0 && c1 >= 0) {
        r0c1 = data[r0 * data_width + c1];
    }
    if (r0 >= 0 && c2 >= 0) {
        r0c2 = data[r0 * data_width + c2];
    }
    if (r1 >= 0 && c0 >= 0) {
        r1c0 = data[r1 * data_width + c0];
    }
    if (r1 >= 0 && c2 >= 0) {
        r1c2 = data[r1 * data_width + c2];
    }
    if (r2 >= 0 && c0 >= 0) {
        r2c0 = data[r2 * data_width + c0];
    }
    if (r2 >= 0 && c1 >= 0) {
        r2c1 = data[r2 * data_width + c1];
    }
    if (r2 >= 0 && c2 >= 0) {
        r2c2 = data[r2 * data_width + c2];
    }


    // *haarX = (r0c1 - r0c2 - r2c1 + r2c2) - (r0c0 - r0c1 - r2c0 + r2c1);
    // *haarY = (r1c0 - r1c2 - r2c0 + r2c2) - (r0c0 - r0c2 - r1c0 + r1c2);

    float r2c2_sub_r0c0 = r2c2 - r0c0;
    float r2c0_sub_r0c2 = r2c0 - r0c2;

    *haarX = 2*(r0c1 - r2c1) + r2c2_sub_r0c0 + r2c0_sub_r0c2;
    *haarY = 2*(r1c0 - r1c2) + r2c2_sub_r0c0 - r2c0_sub_r0c2;

    // for FMA
    // *haarX = (2*r0c1 + r2c0_sub_r0c2) - (2*r2c1 - r2c2_sub_r0c0);
    // *haarY = (2*r1c0 - r2c0_sub_r0c2) - (2*r1c2 - r2c2_sub_r0c0);
}